

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

double __thiscall icu_63::FixedDecimal::getPluralOperand(FixedDecimal *this,PluralOperand operand)

{
  switch(operand) {
  default:
    return this->source;
  case PLURAL_OPERAND_I:
    return (double)this->intValue;
  case PLURAL_OPERAND_F:
    return (double)this->decimalDigits;
  case PLURAL_OPERAND_T:
    return (double)this->decimalDigitsWithoutTrailingZeros;
  case PLURAL_OPERAND_V:
    return (double)this->visibleDecimalDigitCount;
  }
}

Assistant:

double FixedDecimal::getPluralOperand(PluralOperand operand) const {
    switch(operand) {
        case PLURAL_OPERAND_N: return source;
        case PLURAL_OPERAND_I: return static_cast<double>(intValue);
        case PLURAL_OPERAND_F: return static_cast<double>(decimalDigits);
        case PLURAL_OPERAND_T: return static_cast<double>(decimalDigitsWithoutTrailingZeros);
        case PLURAL_OPERAND_V: return visibleDecimalDigitCount;
        default:
             U_ASSERT(FALSE);  // unexpected.
             return source;
    }
}